

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O1

void __thiscall
cmGraphVizWriter::ReadSettings
          (cmGraphVizWriter *this,char *settingsFileName,char *fallbackSettingsFileName)

{
  pointer pcVar1;
  char *pcVar2;
  undefined8 uVar3;
  pointer pbVar4;
  bool bVar5;
  cmLocalGenerator *pcVar6;
  size_t sVar7;
  char *pcVar8;
  ostream *poVar9;
  pointer pBVar10;
  RegularExpression currentRegex;
  string ignoreTargetsRegexes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ignoreTargetsRegExVector;
  cmMakefile mf;
  cmake cm;
  cmGlobalGenerator ggi;
  undefined1 local_1288 [16];
  undefined1 local_1278 [176];
  char *local_11c8;
  undefined1 local_11b8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1198;
  undefined1 local_1178 [2024];
  cmake local_990;
  cmGlobalGenerator local_638;
  
  cmake::cmake(&local_990,RoleScript,Unknown);
  pcVar1 = local_1178 + 0x10;
  local_1178._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1178,"");
  cmake::SetHomeDirectory(&local_990,(string *)local_1178);
  if ((pointer)local_1178._0_8_ != pcVar1) {
    operator_delete((void *)local_1178._0_8_,local_1178._16_8_ + 1);
  }
  local_1178._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1178,"");
  cmake::SetHomeOutputDirectory(&local_990,(string *)local_1178);
  if ((pointer)local_1178._0_8_ != pcVar1) {
    operator_delete((void *)local_1178._0_8_,local_1178._16_8_ + 1);
  }
  local_1178._16_8_ = local_990.CurrentSnapshot.Position.Position;
  local_1178._0_8_ = local_990.CurrentSnapshot.State;
  local_1178._8_8_ = local_990.CurrentSnapshot.Position.Tree;
  cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)local_1178);
  cmGlobalGenerator::cmGlobalGenerator(&local_638,&local_990);
  local_1278._0_8_ = local_990.CurrentSnapshot.Position.Position;
  local_1288._0_8_ = local_990.CurrentSnapshot.State;
  local_1288._8_8_ = local_990.CurrentSnapshot.Position.Tree;
  cmMakefile::cmMakefile((cmMakefile *)local_1178,&local_638,(cmStateSnapshot *)local_1288);
  pcVar6 = cmGlobalGenerator::CreateLocalGenerator(&local_638,(cmMakefile *)local_1178);
  bVar5 = cmsys::SystemTools::FileExists(settingsFileName);
  if (!bVar5) {
    bVar5 = cmsys::SystemTools::FileExists(fallbackSettingsFileName);
    settingsFileName = fallbackSettingsFileName;
    if (!bVar5) goto LAB_002fc8d3;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1288,settingsFileName,(allocator<char> *)local_11b8);
  bVar5 = cmMakefile::ReadListFile((cmMakefile *)local_1178,(string *)local_1288);
  if ((cmState *)local_1288._0_8_ != (cmState *)local_1278) {
    operator_delete((void *)local_1288._0_8_,local_1278._0_8_ + 1);
  }
  if (bVar5) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Reading GraphViz options file: ",0x1f);
    if (settingsFileName == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x604730);
    }
    else {
      sVar7 = strlen(settingsFileName);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,settingsFileName,sVar7);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
    std::ostream::put('0');
    std::ostream::flush();
    local_1288._0_8_ = (cmState *)local_1278;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1288,"GRAPHVIZ_GRAPH_TYPE","");
    pcVar8 = cmMakefile::GetDefinition((cmMakefile *)local_1178,(string *)local_1288);
    if ((cmState *)local_1288._0_8_ != (cmState *)local_1278) {
      operator_delete((void *)local_1288._0_8_,local_1278._0_8_ + 1);
    }
    if (pcVar8 != (char *)0x0) {
      pcVar2 = (char *)(this->GraphType)._M_string_length;
      strlen(pcVar8);
      std::__cxx11::string::_M_replace((ulong)this,0,pcVar2,(ulong)pcVar8);
    }
    local_1288._0_8_ = (cmState *)local_1278;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1288,"GRAPHVIZ_GRAPH_NAME","");
    pcVar8 = cmMakefile::GetDefinition((cmMakefile *)local_1178,(string *)local_1288);
    if ((cmState *)local_1288._0_8_ != (cmState *)local_1278) {
      operator_delete((void *)local_1288._0_8_,local_1278._0_8_ + 1);
    }
    if (pcVar8 != (char *)0x0) {
      pcVar2 = (char *)(this->GraphName)._M_string_length;
      strlen(pcVar8);
      std::__cxx11::string::_M_replace((ulong)&this->GraphName,0,pcVar2,(ulong)pcVar8);
    }
    local_1288._0_8_ = (cmState *)local_1278;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1288,"GRAPHVIZ_GRAPH_HEADER","")
    ;
    pcVar8 = cmMakefile::GetDefinition((cmMakefile *)local_1178,(string *)local_1288);
    if ((cmState *)local_1288._0_8_ != (cmState *)local_1278) {
      operator_delete((void *)local_1288._0_8_,local_1278._0_8_ + 1);
    }
    if (pcVar8 != (char *)0x0) {
      pcVar2 = (char *)(this->GraphHeader)._M_string_length;
      strlen(pcVar8);
      std::__cxx11::string::_M_replace((ulong)&this->GraphHeader,0,pcVar2,(ulong)pcVar8);
    }
    local_1288._0_8_ = (cmState *)local_1278;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1288,"GRAPHVIZ_NODE_PREFIX","");
    pcVar8 = cmMakefile::GetDefinition((cmMakefile *)local_1178,(string *)local_1288);
    if ((cmState *)local_1288._0_8_ != (cmState *)local_1278) {
      operator_delete((void *)local_1288._0_8_,local_1278._0_8_ + 1);
    }
    if (pcVar8 != (char *)0x0) {
      pcVar2 = (char *)(this->GraphNodePrefix)._M_string_length;
      strlen(pcVar8);
      std::__cxx11::string::_M_replace((ulong)&this->GraphNodePrefix,0,pcVar2,(ulong)pcVar8);
    }
    local_1288._0_8_ = (cmState *)local_1278;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1288,"GRAPHVIZ_EXECUTABLES","");
    pcVar8 = cmMakefile::GetDefinition((cmMakefile *)local_1178,(string *)local_1288);
    if ((cmState *)local_1288._0_8_ != (cmState *)local_1278) {
      operator_delete((void *)local_1288._0_8_,local_1278._0_8_ + 1);
    }
    if (pcVar8 != (char *)0x0) {
      local_1288._0_8_ = (cmState *)local_1278;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1288,"GRAPHVIZ_EXECUTABLES","");
      bVar5 = cmMakefile::IsOn((cmMakefile *)local_1178,(string *)local_1288);
      this->GenerateForExecutables = bVar5;
      if ((cmState *)local_1288._0_8_ != (cmState *)local_1278) {
        operator_delete((void *)local_1288._0_8_,local_1278._0_8_ + 1);
      }
    }
    local_1288._0_8_ = (cmState *)local_1278;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1288,"GRAPHVIZ_STATIC_LIBS","");
    pcVar8 = cmMakefile::GetDefinition((cmMakefile *)local_1178,(string *)local_1288);
    if ((cmState *)local_1288._0_8_ != (cmState *)local_1278) {
      operator_delete((void *)local_1288._0_8_,local_1278._0_8_ + 1);
    }
    if (pcVar8 != (char *)0x0) {
      local_1288._0_8_ = (cmState *)local_1278;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1288,"GRAPHVIZ_STATIC_LIBS","");
      bVar5 = cmMakefile::IsOn((cmMakefile *)local_1178,(string *)local_1288);
      this->GenerateForStaticLibs = bVar5;
      if ((cmState *)local_1288._0_8_ != (cmState *)local_1278) {
        operator_delete((void *)local_1288._0_8_,local_1278._0_8_ + 1);
      }
    }
    local_1288._0_8_ = (cmState *)local_1278;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1288,"GRAPHVIZ_SHARED_LIBS","");
    pcVar8 = cmMakefile::GetDefinition((cmMakefile *)local_1178,(string *)local_1288);
    if ((cmState *)local_1288._0_8_ != (cmState *)local_1278) {
      operator_delete((void *)local_1288._0_8_,local_1278._0_8_ + 1);
    }
    if (pcVar8 != (char *)0x0) {
      local_1288._0_8_ = (cmState *)local_1278;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1288,"GRAPHVIZ_SHARED_LIBS","");
      bVar5 = cmMakefile::IsOn((cmMakefile *)local_1178,(string *)local_1288);
      this->GenerateForSharedLibs = bVar5;
      if ((cmState *)local_1288._0_8_ != (cmState *)local_1278) {
        operator_delete((void *)local_1288._0_8_,local_1278._0_8_ + 1);
      }
    }
    local_1288._0_8_ = (cmState *)local_1278;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1288,"GRAPHVIZ_MODULE_LIBS","");
    pcVar8 = cmMakefile::GetDefinition((cmMakefile *)local_1178,(string *)local_1288);
    if ((cmState *)local_1288._0_8_ != (cmState *)local_1278) {
      operator_delete((void *)local_1288._0_8_,local_1278._0_8_ + 1);
    }
    if (pcVar8 != (char *)0x0) {
      local_1288._0_8_ = (cmState *)local_1278;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1288,"GRAPHVIZ_MODULE_LIBS","");
      bVar5 = cmMakefile::IsOn((cmMakefile *)local_1178,(string *)local_1288);
      this->GenerateForModuleLibs = bVar5;
      if ((cmState *)local_1288._0_8_ != (cmState *)local_1278) {
        operator_delete((void *)local_1288._0_8_,local_1278._0_8_ + 1);
      }
    }
    local_1288._0_8_ = (cmState *)local_1278;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1288,"GRAPHVIZ_INTERFACE","");
    pcVar8 = cmMakefile::GetDefinition((cmMakefile *)local_1178,(string *)local_1288);
    if ((cmState *)local_1288._0_8_ != (cmState *)local_1278) {
      operator_delete((void *)local_1288._0_8_,local_1278._0_8_ + 1);
    }
    if (pcVar8 != (char *)0x0) {
      local_1288._0_8_ = (cmState *)local_1278;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1288,"GRAPHVIZ_INTERFACE","");
      bVar5 = cmMakefile::IsOn((cmMakefile *)local_1178,(string *)local_1288);
      this->GenerateForInterface = bVar5;
      if ((cmState *)local_1288._0_8_ != (cmState *)local_1278) {
        operator_delete((void *)local_1288._0_8_,local_1278._0_8_ + 1);
      }
    }
    local_1288._0_8_ = (cmState *)local_1278;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1288,"GRAPHVIZ_EXTERNAL_LIBS","");
    pcVar8 = cmMakefile::GetDefinition((cmMakefile *)local_1178,(string *)local_1288);
    if ((cmState *)local_1288._0_8_ != (cmState *)local_1278) {
      operator_delete((void *)local_1288._0_8_,local_1278._0_8_ + 1);
    }
    if (pcVar8 != (char *)0x0) {
      local_1288._0_8_ = (cmState *)local_1278;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1288,"GRAPHVIZ_EXTERNAL_LIBS","");
      bVar5 = cmMakefile::IsOn((cmMakefile *)local_1178,(string *)local_1288);
      this->GenerateForExternals = bVar5;
      if ((cmState *)local_1288._0_8_ != (cmState *)local_1278) {
        operator_delete((void *)local_1288._0_8_,local_1278._0_8_ + 1);
      }
    }
    local_1288._0_8_ = (cmState *)local_1278;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1288,"GRAPHVIZ_GENERATE_PER_TARGET","");
    pcVar8 = cmMakefile::GetDefinition((cmMakefile *)local_1178,(string *)local_1288);
    if ((cmState *)local_1288._0_8_ != (cmState *)local_1278) {
      operator_delete((void *)local_1288._0_8_,local_1278._0_8_ + 1);
    }
    if (pcVar8 != (char *)0x0) {
      local_1288._0_8_ = (cmState *)local_1278;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1288,"GRAPHVIZ_GENERATE_PER_TARGET","");
      bVar5 = cmMakefile::IsOn((cmMakefile *)local_1178,(string *)local_1288);
      this->GeneratePerTarget = bVar5;
      if ((cmState *)local_1288._0_8_ != (cmState *)local_1278) {
        operator_delete((void *)local_1288._0_8_,local_1278._0_8_ + 1);
      }
    }
    local_1288._0_8_ = (cmState *)local_1278;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1288,"GRAPHVIZ_GENERATE_DEPENDERS","");
    pcVar8 = cmMakefile::GetDefinition((cmMakefile *)local_1178,(string *)local_1288);
    if ((cmState *)local_1288._0_8_ != (cmState *)local_1278) {
      operator_delete((void *)local_1288._0_8_,local_1278._0_8_ + 1);
    }
    if (pcVar8 != (char *)0x0) {
      local_1288._0_8_ = (cmState *)local_1278;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1288,"GRAPHVIZ_GENERATE_DEPENDERS","");
      bVar5 = cmMakefile::IsOn((cmMakefile *)local_1178,(string *)local_1288);
      this->GenerateDependers = bVar5;
      if ((cmState *)local_1288._0_8_ != (cmState *)local_1278) {
        operator_delete((void *)local_1288._0_8_,local_1278._0_8_ + 1);
      }
    }
    local_11b8._0_8_ = local_11b8 + 0x10;
    local_11b8._8_8_ = (_Base_ptr)0x0;
    local_11b8[0x10] = '\0';
    local_1288._0_8_ = (cmState *)local_1278;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1288,"GRAPHVIZ_IGNORE_TARGETS","");
    pcVar8 = cmMakefile::GetDefinition((cmMakefile *)local_1178,(string *)local_1288);
    if ((cmState *)local_1288._0_8_ != (cmState *)local_1278) {
      operator_delete((void *)local_1288._0_8_,local_1278._0_8_ + 1);
    }
    uVar3 = local_11b8._8_8_;
    if (pcVar8 != (char *)0x0) {
      strlen(pcVar8);
      std::__cxx11::string::_M_replace((ulong)local_11b8,0,(char *)uVar3,(ulong)pcVar8);
    }
    std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
              (&this->TargetsToIgnoreRegex);
    if ((_Base_ptr)local_11b8._8_8_ != (_Base_ptr)0x0) {
      local_1198.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1198.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1198.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cmSystemTools::ExpandListArgument((string *)local_11b8,&local_1198,false);
      pbVar4 = local_1198.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_1198.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_1198.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pBVar10 = (pointer)local_1198.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
        do {
          local_1288._0_8_ = (cmState *)0x0;
          local_1278._64_8_ = (pointer)0x0;
          local_1278._144_8_ = (_Base_ptr)0x0;
          local_11c8 = (char *)0x0;
          bVar5 = cmsys::RegularExpression::compile
                            ((RegularExpression *)local_1288,
                             *(char **)&(((CacheEntryMap *)&pBVar10->DirectoryEnd)->_M_t)._M_impl);
          if (!bVar5) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Could not compile bad regex \"",0x1d);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,
                                *(char **)&(((CacheEntryMap *)&pBVar10->DirectoryEnd)->_M_t)._M_impl
                                ,*(long *)&(((CacheEntryMap *)&pBVar10->DirectoryEnd)->_M_t)._M_impl
                                           .super__Rb_tree_header._M_header);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\"",1);
            std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
            std::ostream::put((char)poVar9);
            std::ostream::flush();
          }
          std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::
          emplace_back<cmsys::RegularExpression>
                    (&this->TargetsToIgnoreRegex,(RegularExpression *)local_1288);
          if (local_11c8 != (char *)0x0) {
            operator_delete__(local_11c8);
          }
          pBVar10 = (pointer)&(pBVar10->Location).field_2;
        } while (pBVar10 != (pointer)pbVar4);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1198);
    }
    if ((_Base_ptr)local_11b8._0_8_ != (_Base_ptr)(local_11b8 + 0x10)) {
      operator_delete((void *)local_11b8._0_8_,CONCAT71(local_11b8._17_7_,local_11b8[0x10]) + 1);
    }
  }
  else {
    cmSystemTools::Error
              ("Problem opening GraphViz options file: ",settingsFileName,(char *)0x0,(char *)0x0);
  }
LAB_002fc8d3:
  if (pcVar6 != (cmLocalGenerator *)0x0) {
    (*pcVar6->_vptr_cmLocalGenerator[1])(pcVar6);
  }
  cmMakefile::~cmMakefile((cmMakefile *)local_1178);
  cmGlobalGenerator::~cmGlobalGenerator(&local_638);
  cmake::~cmake(&local_990);
  return;
}

Assistant:

void cmGraphVizWriter::ReadSettings(const char* settingsFileName,
                                    const char* fallbackSettingsFileName)
{
  cmake cm(cmake::RoleScript, cmState::Unknown);
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  cm.GetCurrentSnapshot().SetDefaultDefinitions();
  cmGlobalGenerator ggi(&cm);
  cmMakefile mf(&ggi, cm.GetCurrentSnapshot());
  std::unique_ptr<cmLocalGenerator> lg(ggi.CreateLocalGenerator(&mf));

  const char* inFileName = settingsFileName;

  if (!cmSystemTools::FileExists(inFileName)) {
    inFileName = fallbackSettingsFileName;
    if (!cmSystemTools::FileExists(inFileName)) {
      return;
    }
  }

  if (!mf.ReadListFile(inFileName)) {
    cmSystemTools::Error("Problem opening GraphViz options file: ",
                         inFileName);
    return;
  }

  std::cout << "Reading GraphViz options file: " << inFileName << std::endl;

#define __set_if_set(var, cmakeDefinition)                                    \
  do {                                                                        \
    const char* value = mf.GetDefinition(cmakeDefinition);                    \
    if (value) {                                                              \
      (var) = value;                                                          \
    }                                                                         \
  } while (false)

  __set_if_set(this->GraphType, "GRAPHVIZ_GRAPH_TYPE");
  __set_if_set(this->GraphName, "GRAPHVIZ_GRAPH_NAME");
  __set_if_set(this->GraphHeader, "GRAPHVIZ_GRAPH_HEADER");
  __set_if_set(this->GraphNodePrefix, "GRAPHVIZ_NODE_PREFIX");

#define __set_bool_if_set(var, cmakeDefinition)                               \
  do {                                                                        \
    const char* value = mf.GetDefinition(cmakeDefinition);                    \
    if (value) {                                                              \
      (var) = mf.IsOn(cmakeDefinition);                                       \
    }                                                                         \
  } while (false)

  __set_bool_if_set(this->GenerateForExecutables, "GRAPHVIZ_EXECUTABLES");
  __set_bool_if_set(this->GenerateForStaticLibs, "GRAPHVIZ_STATIC_LIBS");
  __set_bool_if_set(this->GenerateForSharedLibs, "GRAPHVIZ_SHARED_LIBS");
  __set_bool_if_set(this->GenerateForModuleLibs, "GRAPHVIZ_MODULE_LIBS");
  __set_bool_if_set(this->GenerateForInterface, "GRAPHVIZ_INTERFACE");
  __set_bool_if_set(this->GenerateForExternals, "GRAPHVIZ_EXTERNAL_LIBS");
  __set_bool_if_set(this->GeneratePerTarget, "GRAPHVIZ_GENERATE_PER_TARGET");
  __set_bool_if_set(this->GenerateDependers, "GRAPHVIZ_GENERATE_DEPENDERS");

  std::string ignoreTargetsRegexes;
  __set_if_set(ignoreTargetsRegexes, "GRAPHVIZ_IGNORE_TARGETS");

  this->TargetsToIgnoreRegex.clear();
  if (!ignoreTargetsRegexes.empty()) {
    std::vector<std::string> ignoreTargetsRegExVector;
    cmSystemTools::ExpandListArgument(ignoreTargetsRegexes,
                                      ignoreTargetsRegExVector);
    for (std::string const& currentRegexString : ignoreTargetsRegExVector) {
      cmsys::RegularExpression currentRegex;
      if (!currentRegex.compile(currentRegexString)) {
        std::cerr << "Could not compile bad regex \"" << currentRegexString
                  << "\"" << std::endl;
      }
      this->TargetsToIgnoreRegex.push_back(std::move(currentRegex));
    }
  }
}